

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deflate.c
# Opt level: O0

int cm_zlib_deflateSetDictionary(z_streamp strm,Bytef *dictionary,uInt dictLength)

{
  internal_state_conflict1 *piVar1;
  uLong uVar2;
  uint local_38;
  IPos hash_head;
  uInt n;
  uInt length;
  deflate_state *s;
  Bytef *pBStack_20;
  uInt dictLength_local;
  Bytef *dictionary_local;
  z_streamp strm_local;
  
  if ((((strm == (z_streamp)0x0) || (strm->state == (internal_state_conflict1 *)0x0)) ||
      (dictionary == (Bytef *)0x0)) ||
     ((strm->state->wrap == 2 || ((strm->state->wrap == 1 && (strm->state->status != 0x2a)))))) {
    strm_local._4_4_ = -2;
  }
  else {
    piVar1 = strm->state;
    if (piVar1->wrap != 0) {
      uVar2 = cm_zlib_adler32(strm->adler,dictionary,dictLength);
      strm->adler = uVar2;
    }
    if (dictLength < 3) {
      strm_local._4_4_ = 0;
    }
    else {
      hash_head = dictLength;
      pBStack_20 = dictionary;
      if (piVar1->w_size - 0x106 < dictLength) {
        hash_head = piVar1->w_size - 0x106;
        pBStack_20 = dictionary + (dictLength - hash_head);
      }
      memcpy(piVar1->window,pBStack_20,(ulong)hash_head);
      piVar1->strstart = hash_head;
      piVar1->block_start = (ulong)hash_head;
      piVar1->ins_h = (uint)*piVar1->window;
      piVar1->ins_h =
           (piVar1->ins_h << ((byte)piVar1->hash_shift & 0x1f) ^ (uint)piVar1->window[1]) &
           piVar1->hash_mask;
      for (local_38 = 0; local_38 <= hash_head - 3; local_38 = local_38 + 1) {
        piVar1->ins_h =
             (piVar1->ins_h << ((byte)piVar1->hash_shift & 0x1f) ^
             (uint)piVar1->window[local_38 + 2]) & piVar1->hash_mask;
        piVar1->prev[local_38 & piVar1->w_mask] = piVar1->head[piVar1->ins_h];
        piVar1->head[piVar1->ins_h] = (Posf)local_38;
      }
      strm_local._4_4_ = 0;
    }
  }
  return strm_local._4_4_;
}

Assistant:

int ZEXPORT deflateSetDictionary (strm, dictionary, dictLength)
    z_streamp strm;
    const Bytef *dictionary;
    uInt  dictLength;
{
    deflate_state *s;
    uInt length = dictLength;
    uInt n;
    IPos hash_head = 0;

    if (strm == Z_NULL || strm->state == Z_NULL || dictionary == Z_NULL ||
        strm->state->wrap == 2 ||
        (strm->state->wrap == 1 && strm->state->status != INIT_STATE))
        return Z_STREAM_ERROR;

    s = strm->state;
    if (s->wrap)
        strm->adler = adler32(strm->adler, dictionary, dictLength);

    if (length < MIN_MATCH) return Z_OK;
    if (length > MAX_DIST(s)) {
        length = MAX_DIST(s);
        dictionary += dictLength - length; /* use the tail of the dictionary */
    }
    zmemcpy(s->window, dictionary, length);
    s->strstart = length;
    s->block_start = (long)length;

    /* Insert all strings in the hash table (except for the last two bytes).
     * s->lookahead stays null, so s->ins_h will be recomputed at the next
     * call of fill_window.
     */
    s->ins_h = s->window[0];
    UPDATE_HASH(s, s->ins_h, s->window[1]);
    for (n = 0; n <= length - MIN_MATCH; n++) {
        INSERT_STRING(s, n, hash_head);
    }
    if (hash_head) hash_head = 0;  /* to make compiler happy */
    return Z_OK;
}